

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

void __thiscall amrex::AmrMesh::ChopGrids(AmrMesh *this,int lev,BoxArray *ba,int target_size)

{
  pointer pIVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  element_type *peVar5;
  long lVar6;
  int iVar8;
  undefined1 auVar7 [16];
  IntVect chunk;
  IntVect local_58;
  uint local_4c;
  int local_48;
  int iStack_44;
  undefined8 uStack_40;
  
  if ((((this->super_AmrInfo).refine_grid_layout_dims.vect[0] != 0) ||
      ((this->super_AmrInfo).refine_grid_layout_dims.vect[1] != 0)) ||
     ((this->super_AmrInfo).refine_grid_layout_dims.vect[2] != 0)) {
    pIVar1 = (this->super_AmrInfo).max_grid_size.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58.vect[2] = pIVar1[lev].vect[2];
    local_58.vect._0_8_ = *(undefined8 *)pIVar1[lev].vect;
    do {
      peVar5 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((long)target_size <=
          ((long)*(pointer *)
                  ((long)&(peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data + 8) -
           *(long *)&(peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7) {
        return;
      }
      local_48 = local_58.vect[0];
      iStack_44 = local_58.vect[1];
      uStack_40 = 0;
      peVar5 = (element_type *)(ulong)(uint)local_58.vect[2];
      local_4c = local_58.vect[2];
      lVar6 = 0;
      do {
        if (((this->super_AmrInfo).refine_grid_layout_dims.vect[lVar6 + 2] != 0) &&
           (peVar5 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           , (*(long *)((long)&((BATransformer *)&peVar5->m_abox)->m_op + 4) -
              *(long *)&peVar5->m_abox >> 2) * 0x6db6db6db6db6db7 < (long)target_size)) {
          iVar8 = local_58.vect[lVar6 + 2];
          lVar2 = (long)(this->super_AmrInfo).blocking_factor.
                        super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                        super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                        super__Vector_impl_data._M_start[lev].vect[lVar6 + 2];
          lVar3 = CONCAT44(iVar8 - (iVar8 >> 0x1f) >> 0x1f,iVar8 / 2);
          peVar5 = (element_type *)(lVar3 / lVar2 & 0xffffffff);
          if ((int)(lVar3 % lVar2) == 0) {
            local_58.vect[lVar6 + 2] = iVar8 / 2;
            peVar5 = (element_type *)BoxArray::maxSize(ba,&local_58);
          }
        }
        lVar6 = lVar6 + -1;
      } while (lVar6 != -3);
      auVar7._0_4_ = -(uint)(local_58.vect[0] == local_48);
      iVar8 = -(uint)(local_58.vect[1] == iStack_44);
      auVar7._4_4_ = auVar7._0_4_;
      auVar7._8_4_ = iVar8;
      auVar7._12_4_ = iVar8;
      uVar4 = movmskpd((int)peVar5,auVar7);
    } while ((((uVar4 & 1) == 0) || ((byte)((byte)uVar4 >> 1) == 0)) ||
            (local_58.vect[2] != local_4c));
  }
  return;
}

Assistant:

void
AmrMesh::ChopGrids (int lev, BoxArray& ba, int target_size) const
{
    if (refine_grid_layout_dims == 0) { return; }

    IntVect chunk = max_grid_size[lev];

    while (ba.size() < target_size)
    {
        IntVect chunk_prev = chunk;

        for (int idim = AMREX_SPACEDIM-1; idim >=0; idim--){
            if (refine_grid_layout_dims[idim]){
                int new_chunk_size = chunk[idim] / 2;
                if ( (ba.size() < target_size) && (new_chunk_size%blocking_factor[lev][idim] == 0))
                {
                    chunk[idim] = new_chunk_size;
                    ba.maxSize(chunk);
                }
            }
        }

        if (chunk == chunk_prev){
            break;
        }
    }

}